

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

green_future_t green_future_init(green_loop_t loop)

{
  green_future_t future;
  green_loop_t loop_local;
  
  if (loop == (green_loop_t)0x0) {
    loop_local = (green_loop_t)0x0;
  }
  else {
    loop_local = (green_loop_t)green_malloc(0x38);
    *(green_loop_t *)loop_local = loop;
    *(undefined4 *)&(loop_local->context).uc_stack.ss_sp = 0;
    loop_local->nextcoroid = 1;
    *(undefined4 *)&(loop_local->context).uc_stack.ss_size = 0xffffffff;
  }
  return (green_future_t)loop_local;
}

Assistant:

green_future_t green_future_init(green_loop_t loop)
{
    if (loop == NULL) {
        return NULL;
    }
    green_future_t future = green_malloc(sizeof(struct green_future));
    future->loop = loop;
    future->state = green_future_pending;
    future->refs = 1;
    future->slot = -1;
    return future;
}